

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O1

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<LookupIdentifier&>
          (MinTypMaxExpression *this,LookupIdentifier *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
            (this->min_,this->min_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
            (this->typ_,this->typ_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
            (this->max_,this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }